

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChatBox.cpp
# Opt level: O0

void __thiscall gui::ChatBox::handleMousePress(ChatBox *this,Button button,Vector2f *mouseParent)

{
  Widget *in_RDX;
  int in_ESI;
  Vector2<float> *in_RDI;
  undefined4 unaff_retaddr;
  Button unaff_retaddr_00;
  Vector2f mouseLocal;
  undefined4 in_stack_00000018;
  bool in_stack_00000037;
  size_t in_stack_00000038;
  ChatBox *in_stack_00000040;
  Vector2f *in_stack_ffffffffffffffe0;
  undefined4 in_stack_fffffffffffffff0;
  Vector2<float> *funcArgs_2;
  
  funcArgs_2 = in_RDI;
  Widget::handleMousePress
            ((Widget *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),(Button)((ulong)in_RDX >> 0x20),
             in_stack_ffffffffffffffe0);
  if (((uint)in_RDI[0x57].x & 1) == 0) {
    Widget::toLocalOriginSpace(in_RDX,in_stack_ffffffffffffffe0);
    if (in_ESI == 0) {
      findClosestLineToMouse((ChatBox *)CONCAT44(button,in_stack_00000018),mouseParent);
      updateSelection(in_stack_00000040,in_stack_00000038,in_stack_00000037);
    }
    if (in_ESI < 3) {
      Signal<gui::Widget_*,_const_sf::Vector2<float>_&>::emit
                ((Signal<gui::Widget_*,_const_sf::Vector2<float>_&> *)mouseParent,
                 (Widget *)mouseLocal,(Vector2<float> *)CONCAT44(unaff_retaddr_00,unaff_retaddr));
    }
    Signal<gui::Widget_*,_sf::Mouse::Button,_const_sf::Vector2<float>_&>::emit
              ((Signal<gui::Widget_*,_sf::Mouse::Button,_const_sf::Vector2<float>_&> *)mouseParent,
               (Widget *)mouseLocal,unaff_retaddr_00,funcArgs_2);
  }
  return;
}

Assistant:

void ChatBox::handleMousePress(sf::Mouse::Button button, const sf::Vector2f& mouseParent) {
    baseClass::handleMousePress(button, mouseParent);
    if (autoHide_) {
        return;
    }
    const auto mouseLocal = toLocalOriginSpace(mouseParent);
    if (button == sf::Mouse::Left) {
        updateSelection(findClosestLineToMouse(mouseLocal), false);
    }
    if (button <= sf::Mouse::Middle) {
        onClick.emit(this, mouseLocal);
    }
    onMousePress.emit(this, button, mouseLocal);
}